

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::Insert(ON_PolyCurve *this,int segment_index,ON_Curve *c)

{
  ON_SimpleArray<double> *this_00;
  double dVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  ulong uVar8;
  double s1;
  double s0;
  double t1;
  double local_68;
  double local_60;
  double local_58;
  ON_Curve *local_50;
  double local_48;
  undefined8 uStack_40;
  double local_30;
  
  pdVar7 = &local_68;
  if (-1 < segment_index) {
    iVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    if ((((ON_PolyCurve *)c != this && c != (ON_Curve *)0x0) && segment_index <= iVar2) &&
       (local_50 = c, bVar3 = ON_Curve::GetDomain(c,&local_60,&local_68), bVar3)) {
      if (iVar2 != 0) {
        iVar4 = (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(c);
        iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                          (this);
        if (iVar4 != iVar5) {
          uVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                            (this);
          iVar4 = (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(c,(ulong)uVar6);
          if ((char)iVar4 == '\0') {
            return false;
          }
        }
      }
      ON_SimpleArray<ON_Curve_*>::Insert
                (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_index,&local_50);
      this_00 = &this->m_t;
      if (iVar2 == segment_index) {
        if (segment_index == 0) {
          ON_SimpleArray<double>::Append(this_00,&local_60);
        }
        else {
          dVar1 = (this->m_t).m_a[(uint)segment_index];
          uVar8 = -(ulong)(local_60 == dVar1);
          local_58 = (double)(uVar8 & (ulong)local_68 |
                             ~uVar8 & (ulong)((local_68 - local_60) + dVar1));
          pdVar7 = &local_58;
        }
        ON_SimpleArray<double>::Append(this_00,pdVar7);
      }
      else {
        pdVar7 = (this->m_t).m_a;
        if (segment_index == 0) {
          local_58 = *pdVar7;
          local_30 = (double)(-(ulong)(local_68 == local_58) & (ulong)local_60 |
                             ~-(ulong)(local_68 == local_58) &
                             (ulong)((local_60 - local_68) + local_58));
          ON_SimpleArray<double>::Insert(this_00,0,&local_30);
        }
        else {
          local_48 = pdVar7[(uint)segment_index];
          local_58 = (double)(-(ulong)(local_60 == local_48) & (ulong)local_68 |
                             ~-(ulong)(local_60 == local_48) &
                             (ulong)((local_68 - local_60) + local_48));
          local_48 = local_58 - local_48;
          uStack_40 = 0;
          ON_SimpleArray<double>::Insert(this_00,segment_index + 1,&local_58);
          pdVar7 = (this->m_t).m_a;
          for (uVar8 = (ulong)(segment_index + 2); (int)uVar8 <= iVar2 + 1; uVar8 = uVar8 + 1) {
            pdVar7[uVar8] = pdVar7[uVar8] + local_48;
          }
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PolyCurve::Insert( int segment_index, ON_Curve* c )
{
  double s0, s1;
  bool rc = false;
  const int count = Count();
  if ( segment_index >= 0 && segment_index <= count && c && c != this && 
		c->GetDomain(&s0,&s1) ) 
  {
		rc = true;
		if (count > 0 && c->Dimension() != Dimension())			// 1-Sept-2017 (GBA)  Dimensions must agree
		{
			rc = c->ChangeDimension(Dimension());									// If not change the dimension of *c to match
		}

		if (rc)
		{
			m_segment.Insert(segment_index, c);

			// determine polycurve parameters for this segment
			double t0, t1;
			if (segment_index == count) {
				// append segment
				if (count == 0) {
					m_t.Append(s0);
					m_t.Append(s1);
				}
				else {
					t0 = m_t[count];
					t1 = (s0 == t0) ? s1 : (s1 - s0 + t0);
					m_t.Append(t1);
				}
			}
			else if (segment_index == 0) {
				// prepend segment
				t1 = m_t[0];
				t0 = (s1 == t1) ? s0 : (s0 - s1 + t1);
				m_t.Insert(0, t0);
			}
			else {
				// insert segment
				t0 = m_t[segment_index];
				t1 = (s0 == t0) ? s1 : (s1 - s0 + t0);
				const double dt = t1 - t0;
				m_t.Insert(segment_index + 1, t1);
				double* t = m_t.Array();
				for (int i = segment_index + 2; i <= count + 1; i++) {
					t[i] += dt;
				}
			}
		}
  }
  return rc;
}